

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unix.h
# Opt level: O1

bool MakeErrMsg(string *ErrMsg,string *prefix,int errnum)

{
  pointer pcVar1;
  undefined1 in_AL;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar2;
  uint *puVar3;
  undefined8 *puVar4;
  long *extraout_RAX;
  long *plVar5;
  int errnum_00;
  ulong uVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  if (ErrMsg == (string *)0x0) {
    return (bool)in_AL;
  }
  if (errnum == -1) {
    puVar3 = (uint *)__errno_location();
    errnum = *puVar3;
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_48);
  llvm::sys::StrError_abi_cxx11_(&local_68,(sys *)(ulong)(uint)errnum,errnum_00);
  uVar6 = 0xf;
  if (local_48 != local_38) {
    uVar6 = local_38[0];
  }
  if (uVar6 < local_68._M_string_length + local_40) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar7 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_40 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_00182772;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
LAB_00182772:
  local_88 = &local_78;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_78 = *plVar5;
    uStack_70 = puVar4[3];
  }
  else {
    local_78 = *plVar5;
    local_88 = (long *)*puVar4;
  }
  local_80 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  std::__cxx11::string::operator=((string *)ErrMsg,(string *)&local_88);
  plVar5 = &local_78;
  if (local_88 != plVar5) {
    operator_delete(local_88,local_78 + 1);
    plVar5 = extraout_RAX;
  }
  uVar2 = SUB81(plVar5,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    uVar2 = extraout_AL;
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
    uVar2 = extraout_AL_00;
  }
  return (bool)uVar2;
}

Assistant:

static inline bool MakeErrMsg(
  std::string* ErrMsg, const std::string& prefix, int errnum = -1) {
  if (!ErrMsg)
    return true;
  if (errnum == -1)
    errnum = errno;
  *ErrMsg = prefix + ": " + llvm::sys::StrError(errnum);
  return true;
}